

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rbuOpenDatabase(sqlite3rbu *p,int *pbRetry)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  sqlite3 *psVar4;
  char *pcVar5;
  RbuState *p_00;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  
  psVar4 = rbuOpenDbhandle(p,p->zRbu,1);
  p->dbRbu = psVar4;
  if (((p->rc == 0) && (p->zTarget == (char *)0x0)) &&
     (sqlite3_file_control(psVar4,"main",0x4e9220,p), p->zState == (char *)0x0)) {
    pcVar5 = sqlite3_db_filename(p->dbRbu,"main");
    pcVar5 = rbuMPrintf(p,"file://%s-vacuum?modeof=%s",pcVar5,pcVar5);
    p->zState = pcVar5;
  }
  if (p->zState == (char *)0x0) {
    uVar2 = 0x6e69616d;
  }
  else {
    rbuMPrintfExec(p,p->dbRbu,"ATTACH %Q AS stat");
    uVar2 = 0x74617473;
  }
  *(undefined4 *)p->zStateDb = uVar2;
  rbuMPrintfExec(p,p->dbRbu,"CREATE TABLE IF NOT EXISTS %s.rbu_state(k INTEGER PRIMARY KEY, v)",
                 p->zStateDb);
  if (p->rc == 0) {
    if (p->zTarget == (char *)0x0) {
      p->nRbu = 0;
      p->pRbuFd = (rbu_file *)0x0;
      iVar3 = sqlite3_file_control(p->dbRbu,"main",0x4e9220,p);
      if (iVar3 != 0xc) {
        p->rc = iVar3;
      }
      if ((1 < p->eStage) ||
         ((p_00 = rbuLoadState(p), p_00 != (RbuState *)0x0 &&
          (iVar3 = p_00->eStage, rbuFreeState(p_00), 1 < iVar3)))) {
        psVar4 = rbuOpenDbhandle(p,p->zRbu,(uint)(p->nRbu < 2));
        p->dbMain = psVar4;
      }
    }
    p->eStage = 0;
    if (p->rc == 0) {
      if (p->dbMain == (sqlite3 *)0x0) {
        if (p->zTarget == (char *)0x0) {
          if (p->pRbuFd->pWalFd == (rbu_file *)0x0) {
            pcVar5 = p->zRbu;
            sVar6 = strlen(pcVar5);
            if ((sVar6 < 5) || (iVar3 = bcmp("file:",pcVar5,5), iVar3 != 0)) {
              pcVar8 = (char *)0x0;
            }
            else {
              pcVar5 = pcVar5 + 5;
              do {
                cVar1 = *pcVar5;
                pcVar8 = (char *)0x0;
                if (cVar1 == '\0') goto LAB_001cb5e1;
                pcVar5 = pcVar5 + 1;
              } while (cVar1 != '?');
              pcVar8 = (char *)0x0;
              if (*pcVar5 != '\0') {
                pcVar8 = pcVar5;
              }
            }
LAB_001cb5e1:
            pcVar7 = sqlite3_db_filename(p->dbRbu,"main");
            pcVar5 = "&";
            if (pcVar8 == (char *)0x0) {
              pcVar5 = "";
              pcVar8 = "";
            }
            pcVar5 = sqlite3_mprintf("file:%s-vactmp?rbu_memory=1%s%s",pcVar7,pcVar5,pcVar8);
            if (pcVar5 == (char *)0x0) {
              p->rc = 7;
              return;
            }
            psVar4 = rbuOpenDbhandle(p,pcVar5,(uint)(p->nRbu < 2));
            p->dbMain = psVar4;
            sqlite3_free(pcVar5);
          }
          else {
            if (pbRetry != (int *)0x0) {
              p->pRbuFd->bNolock = '\0';
              sqlite3_close(p->dbRbu);
              sqlite3_close(p->dbMain);
              p->dbMain = (sqlite3 *)0x0;
              p->dbRbu = (sqlite3 *)0x0;
              *pbRetry = 1;
              return;
            }
            p->rc = 1;
            pcVar5 = sqlite3_mprintf("cannot vacuum wal mode database");
            p->zErrmsg = pcVar5;
          }
        }
        else {
          psVar4 = rbuOpenDbhandle(p,p->zTarget,1);
          p->dbMain = psVar4;
        }
      }
      if (p->rc == 0) {
        iVar3 = sqlite3_create_function
                          (p->dbMain,"rbu_tmp_insert",-1,1,p,rbuTmpInsertFunc,
                           (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                           (_func_void_sqlite3_context_ptr *)0x0);
        p->rc = iVar3;
        if (iVar3 == 0) {
          iVar3 = sqlite3_create_function
                            (p->dbMain,"rbu_fossil_delta",2,1,(void *)0x0,rbuFossilDeltaFunc,
                             (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                             (_func_void_sqlite3_context_ptr *)0x0);
          p->rc = iVar3;
          if (iVar3 == 0) {
            iVar3 = sqlite3_create_function
                              (p->dbRbu,"rbu_target_name",-1,1,p,rbuTargetNameFunc,
                               (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                               (_func_void_sqlite3_context_ptr *)0x0);
            p->rc = iVar3;
            if (iVar3 == 0) {
              iVar3 = sqlite3_file_control(p->dbMain,"main",0x1a,p);
              p->rc = iVar3;
            }
          }
        }
      }
    }
  }
  else {
    p->eStage = 0;
  }
  rbuMPrintfExec(p,p->dbMain,"SELECT * FROM sqlite_master");
  iVar3 = p->rc;
  if (iVar3 == 0) {
    iVar3 = sqlite3_file_control(p->dbMain,"main",0x1a,p);
    p->rc = iVar3;
  }
  if (iVar3 == 0xc) {
    p->rc = 1;
    pcVar5 = sqlite3_mprintf("rbu vfs not found");
    p->zErrmsg = pcVar5;
  }
  return;
}

Assistant:

static void rbuOpenDatabase(sqlite3rbu *p, int *pbRetry){
  assert( p->rc || (p->dbMain==0 && p->dbRbu==0) );
  assert( p->rc || rbuIsVacuum(p) || p->zTarget!=0 );

  /* Open the RBU database */
  p->dbRbu = rbuOpenDbhandle(p, p->zRbu, 1);

  if( p->rc==SQLITE_OK && rbuIsVacuum(p) ){
    sqlite3_file_control(p->dbRbu, "main", SQLITE_FCNTL_RBUCNT, (void*)p);
    if( p->zState==0 ){
      const char *zFile = sqlite3_db_filename(p->dbRbu, "main");
      p->zState = rbuMPrintf(p, "file://%s-vacuum?modeof=%s", zFile, zFile);
    }
  }

  /* If using separate RBU and state databases, attach the state database to
  ** the RBU db handle now.  */
  if( p->zState ){
    rbuMPrintfExec(p, p->dbRbu, "ATTACH %Q AS stat", p->zState);
    memcpy(p->zStateDb, "stat", 4);
  }else{
    memcpy(p->zStateDb, "main", 4);
  }

#if 0
  if( p->rc==SQLITE_OK && rbuIsVacuum(p) ){
    p->rc = sqlite3_exec(p->dbRbu, "BEGIN", 0, 0, 0);
  }
#endif

  /* If it has not already been created, create the rbu_state table */
  rbuMPrintfExec(p, p->dbRbu, RBU_CREATE_STATE, p->zStateDb);

#if 0
  if( rbuIsVacuum(p) ){
    if( p->rc==SQLITE_OK ){
      int rc2;
      int bOk = 0;
      sqlite3_stmt *pCnt = 0;
      p->rc = prepareAndCollectError(p->dbRbu, &pCnt, &p->zErrmsg,
          "SELECT count(*) FROM stat.sqlite_master"
      );
      if( p->rc==SQLITE_OK 
       && sqlite3_step(pCnt)==SQLITE_ROW
       && 1==sqlite3_column_int(pCnt, 0)
      ){
        bOk = 1;
      }
      rc2 = sqlite3_finalize(pCnt);
      if( p->rc==SQLITE_OK ) p->rc = rc2;

      if( p->rc==SQLITE_OK && bOk==0 ){
        p->rc = SQLITE_ERROR;
        p->zErrmsg = sqlite3_mprintf("invalid state database");
      }
    
      if( p->rc==SQLITE_OK ){
        p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, 0);
      }
    }
  }
#endif

  if( p->rc==SQLITE_OK && rbuIsVacuum(p) ){
    int bOpen = 0;
    int rc;
    p->nRbu = 0;
    p->pRbuFd = 0;
    rc = sqlite3_file_control(p->dbRbu, "main", SQLITE_FCNTL_RBUCNT, (void*)p);
    if( rc!=SQLITE_NOTFOUND ) p->rc = rc;
    if( p->eStage>=RBU_STAGE_MOVE ){
      bOpen = 1;
    }else{
      RbuState *pState = rbuLoadState(p);
      if( pState ){
        bOpen = (pState->eStage>=RBU_STAGE_MOVE);
        rbuFreeState(pState);
      }
    }
    if( bOpen ) p->dbMain = rbuOpenDbhandle(p, p->zRbu, p->nRbu<=1);
  }

  p->eStage = 0;
  if( p->rc==SQLITE_OK && p->dbMain==0 ){
    if( !rbuIsVacuum(p) ){
      p->dbMain = rbuOpenDbhandle(p, p->zTarget, 1);
    }else if( p->pRbuFd->pWalFd ){
      if( pbRetry ){
        p->pRbuFd->bNolock = 0;
        sqlite3_close(p->dbRbu);
        sqlite3_close(p->dbMain);
        p->dbMain = 0;
        p->dbRbu = 0;
        *pbRetry = 1;
        return;
      }
      p->rc = SQLITE_ERROR;
      p->zErrmsg = sqlite3_mprintf("cannot vacuum wal mode database");
    }else{
      char *zTarget;
      char *zExtra = 0;
      if( strlen(p->zRbu)>=5 && 0==memcmp("file:", p->zRbu, 5) ){
        zExtra = &p->zRbu[5];
        while( *zExtra ){
          if( *zExtra++=='?' ) break;
        }
        if( *zExtra=='\0' ) zExtra = 0;
      }

      zTarget = sqlite3_mprintf("file:%s-vactmp?rbu_memory=1%s%s", 
          sqlite3_db_filename(p->dbRbu, "main"),
          (zExtra==0 ? "" : "&"), (zExtra==0 ? "" : zExtra)
      );

      if( zTarget==0 ){
        p->rc = SQLITE_NOMEM;
        return;
      }
      p->dbMain = rbuOpenDbhandle(p, zTarget, p->nRbu<=1);
      sqlite3_free(zTarget);
    }
  }

  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_create_function(p->dbMain, 
        "rbu_tmp_insert", -1, SQLITE_UTF8, (void*)p, rbuTmpInsertFunc, 0, 0
    );
  }

  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_create_function(p->dbMain, 
        "rbu_fossil_delta", 2, SQLITE_UTF8, 0, rbuFossilDeltaFunc, 0, 0
    );
  }

  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_create_function(p->dbRbu, 
        "rbu_target_name", -1, SQLITE_UTF8, (void*)p, rbuTargetNameFunc, 0, 0
    );
  }

  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_file_control(p->dbMain, "main", SQLITE_FCNTL_RBU, (void*)p);
  }
  rbuMPrintfExec(p, p->dbMain, "SELECT * FROM sqlite_master");

  /* Mark the database file just opened as an RBU target database. If 
  ** this call returns SQLITE_NOTFOUND, then the RBU vfs is not in use.
  ** This is an error.  */
  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_file_control(p->dbMain, "main", SQLITE_FCNTL_RBU, (void*)p);
  }

  if( p->rc==SQLITE_NOTFOUND ){
    p->rc = SQLITE_ERROR;
    p->zErrmsg = sqlite3_mprintf("rbu vfs not found");
  }
}